

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptLibrary.cpp
# Opt level: O2

JavascriptAsyncSpawnStepFunction * __thiscall
Js::JavascriptLibrary::CreateAsyncSpawnStepFunction
          (JavascriptLibrary *this,JavascriptMethod entryPoint,JavascriptGenerator *generator,
          Var argument,Var resolve,Var reject,bool isReject)

{
  Recycler *pRVar1;
  FunctionInfo *this_00;
  DynamicType *type;
  JavascriptAsyncSpawnStepFunction *this_01;
  undefined1 local_78 [8];
  TrackAllocData data;
  InfoBitsWrapper<(Memory::ObjectInfoBits)1> local_31;
  
  local_78 = (undefined1  [8])&FunctionInfo::typeinfo;
  data.typeinfo = (type_info *)0x0;
  data.plusSize = 0xffffffffffffffff;
  data.count = (size_t)anon_var_dwarf_74a5554;
  data.filename._0_4_ = 0x1831;
  data._32_8_ = reject;
  pRVar1 = Memory::Recycler::TrackAllocInfo(this->recycler,(TrackAllocData *)local_78);
  this_00 = (FunctionInfo *)new<Memory::Recycler>(0x20,pRVar1,0x37a1d4);
  FunctionInfo::FunctionInfo(this_00,entryPoint,None,0xffffffff,(FunctionProxy *)0x0);
  if (this->inDispatchProfileMode != false) {
    entryPoint = ScriptContext::DebugProfileProbeThunk;
  }
  type = CreateDeferredPrototypeFunctionType(this,entryPoint);
  local_78 = (undefined1  [8])&JavascriptAsyncSpawnStepFunction::typeinfo;
  data.typeinfo = (type_info *)0x0;
  data.plusSize = 0xffffffffffffffff;
  data.count = (size_t)anon_var_dwarf_74a5554;
  data.filename._0_4_ = 0x183f;
  pRVar1 = Memory::Recycler::TrackAllocInfo(this->recycler,(TrackAllocData *)local_78);
  this_01 = (JavascriptAsyncSpawnStepFunction *)
            new<(Memory::ObjectInfoBits)1>(0x68,pRVar1,&local_31);
  JavascriptAsyncSpawnStepFunction::JavascriptAsyncSpawnStepFunction
            (this_01,type,this_00,generator,argument,resolve,(Var)data._32_8_,isReject);
  return this_01;
}

Assistant:

JavascriptAsyncSpawnStepFunction* JavascriptLibrary::CreateAsyncSpawnStepFunction(
        JavascriptMethod entryPoint,
        JavascriptGenerator* generator,
        Var argument,
        Var resolve,
        Var reject,
        bool isReject)
    {
        FunctionInfo* functionInfo = RecyclerNew(GetRecycler(), FunctionInfo, entryPoint);
        DynamicType* type = CreateDeferredPrototypeFunctionType(
            this->inDispatchProfileMode ? ProfileEntryThunk : entryPoint);

        return RecyclerNewEnumClass(
            GetRecycler(),
            EnumFunctionClass,
            JavascriptAsyncSpawnStepFunction,
            type,
            functionInfo,
            generator,
            argument,
            resolve,
            reject,
            isReject);
    }